

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::MessageLite::SerializePartialAsString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  bool bVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = AppendPartialToString(this,__return_storage_ptr__);
  if (!bVar1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

string MessageLite::SerializePartialAsString() const {
  string output;
  if (!AppendPartialToString(&output))
    output.clear();
  return output;
}